

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalValueDatabase.cpp
# Opt level: O0

void __thiscall
OptimalValueDatabase::OptimalValueDatabase
          (OptimalValueDatabase *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  DecPOMDPDiscreteInterface *pDVar1;
  size_t sVar2;
  PlanningUnitDecPOMDPDiscrete *in_RSI;
  long in_RDI;
  double dVar3;
  OptimalValueDatabase *in_stack_000005a0;
  
  std::
  map<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double,_std::less<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>_>_>
  ::map((map<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double,_std::less<std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_unsigned_long>,_double>_>_>
         *)0x8dd125);
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  pDVar1 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(in_RSI);
  (**(code **)(*(long *)(&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0x40)) + 0x20))
            (in_RDI + 0x50,&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0x40));
  dVar3 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8dd192);
  *(double *)(in_RDI + 0x70) = dVar3;
  sVar2 = PlanningUnit::GetHorizon((PlanningUnit *)in_RSI);
  *(size_t *)(in_RDI + 0x78) = sVar2;
  Load(in_stack_000005a0);
  return;
}

Assistant:

OptimalValueDatabase::OptimalValueDatabase(
    const PlanningUnitDecPOMDPDiscrete* pu) :
    _m_problemName(pu->GetDPOMDPD()->GetUnixName()),
    _m_discount(pu->GetDiscount()),
    _m_horizon(pu->GetHorizon())
{
    Load();
}